

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O2

void share_connstate_free(ssh_sharing_connstate *cs)

{
  share_globreq *ptr;
  Socket *pSVar1;
  void *pvVar2;
  share_xchannel *xc;
  
  while( true ) {
    pvVar2 = delpos234(cs->halfchannels,0);
    if (pvVar2 == (void *)0x0) break;
    safefree(pvVar2);
  }
  freetree234(cs->halfchannels);
  freetree234(cs->channels_by_server);
  while( true ) {
    pvVar2 = delpos234(cs->channels_by_us,0);
    if (pvVar2 == (void *)0x0) break;
    safefree(pvVar2);
  }
  freetree234(cs->channels_by_us);
  while( true ) {
    xc = (share_xchannel *)delpos234(cs->xchannels_by_us,0);
    if (xc == (share_xchannel *)0x0) break;
    share_xchannel_free(xc);
  }
  freetree234(cs->xchannels_by_us);
  freetree234(cs->xchannels_by_server);
  while( true ) {
    pvVar2 = delpos234(cs->forwardings,0);
    if (pvVar2 == (void *)0x0) break;
    safefree(pvVar2);
  }
  freetree234(cs->forwardings);
  while (ptr = cs->globreq_head, ptr != (share_globreq *)0x0) {
    cs->globreq_head = ptr->next;
    safefree(ptr);
  }
  pSVar1 = cs->sock;
  if (pSVar1 != (Socket *)0x0) {
    (*pSVar1->vt->close)(pSVar1);
  }
  safefree(cs);
  return;
}

Assistant:

static void share_connstate_free(struct ssh_sharing_connstate *cs)
{
    struct share_halfchannel *hc;
    struct share_xchannel *xc;
    struct share_channel *chan;
    struct share_forwarding *fwd;

    while ((hc = (struct share_halfchannel *)
            delpos234(cs->halfchannels, 0)) != NULL)
        sfree(hc);
    freetree234(cs->halfchannels);

    /* All channels live in 'channels_by_us' but only some in
     * 'channels_by_server', so we use the former to find the list of
     * ones to free */
    freetree234(cs->channels_by_server);
    while ((chan = (struct share_channel *)
            delpos234(cs->channels_by_us, 0)) != NULL)
        sfree(chan);
    freetree234(cs->channels_by_us);

    /* But every xchannel is in both trees, so it doesn't matter which
     * we use to free them. */
    while ((xc = (struct share_xchannel *)
            delpos234(cs->xchannels_by_us, 0)) != NULL)
        share_xchannel_free(xc);
    freetree234(cs->xchannels_by_us);
    freetree234(cs->xchannels_by_server);

    while ((fwd = (struct share_forwarding *)
            delpos234(cs->forwardings, 0)) != NULL)
        sfree(fwd);
    freetree234(cs->forwardings);

    while (cs->globreq_head) {
        struct share_globreq *globreq = cs->globreq_head;
        cs->globreq_head = cs->globreq_head->next;
        sfree(globreq);
    }

    if (cs->sock)
        sk_close(cs->sock);

    sfree(cs);
}